

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_sdbl.h
# Opt level: O0

vec_sdbl_t * vec_sdbl_alloc(uint cap)

{
  vec_sdbl_t *pvVar1;
  sdbl_t *local_20;
  vec_sdbl_t *p;
  uint cap_local;
  
  pvVar1 = (vec_sdbl_t *)malloc(0x10);
  p._4_4_ = cap;
  if ((cap != 0) && (cap < 0x10)) {
    p._4_4_ = 0x10;
  }
  pvVar1->size = 0;
  pvVar1->cap = p._4_4_;
  if (pvVar1->cap == 0) {
    local_20 = (sdbl_t *)0x0;
  }
  else {
    local_20 = (sdbl_t *)malloc((ulong)pvVar1->cap << 3);
  }
  pvVar1->data = local_20;
  return pvVar1;
}

Assistant:

static inline vec_sdbl_t *vec_sdbl_alloc(unsigned cap)
{
    vec_sdbl_t* p = satoko_alloc(vec_sdbl_t, 1);

    if (cap > 0 && cap < 16)
        cap = 16;
    p->size = 0;
    p->cap = cap;
    p->data = p->cap ? satoko_alloc(sdbl_t, p->cap) : NULL;
    return p;
}